

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void bc_trie_foreach_node
               (bc_trie_node_t *node,bc_string_t *str,bc_trie_foreach_func_t func,void *user_data)

{
  bc_string_t *pbVar1;
  
  while( true ) {
    if (node == (bc_trie_node_t *)0x0) {
      return;
    }
    if (str == (bc_string_t *)0x0) break;
    if (node->key == '\0') {
      (*func)(str->str,node->data,user_data);
    }
    if (node->child != (_bc_trie_node_t *)0x0) {
      pbVar1 = bc_string_dup(str);
      pbVar1 = bc_string_append_c(pbVar1,node->key);
      bc_trie_foreach_node(node->child,pbVar1,func,user_data);
      if (pbVar1 != (bc_string_t *)0x0) {
        free(pbVar1->str);
        free(pbVar1);
      }
    }
    node = node->next;
    if (node == (_bc_trie_node_t *)0x0) {
      return;
    }
  }
  return;
}

Assistant:

static void
bc_trie_foreach_node(bc_trie_node_t *node, bc_string_t *str,
    bc_trie_foreach_func_t func, void *user_data)
{
    if (node == NULL || str == NULL || func == NULL)
        return;

    if (node->key == '\0')
        func(str->str, node->data, user_data);

    if (node->child != NULL) {
        bc_string_t *child = bc_string_dup(str);
        child = bc_string_append_c(child, node->key);
        bc_trie_foreach_node(node->child, child, func, user_data);
        bc_string_free(child, true);
    }

    if (node->next != NULL)
        bc_trie_foreach_node(node->next, str, func, user_data);
}